

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O3

Validator * __thiscall
CLI::Validator::operator&(Validator *__return_storage_ptr__,Validator *this,Validator *other)

{
  undefined1 uVar1;
  _Any_data local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Any_data local_40;
  code *local_30;
  
  *(undefined8 *)&(__return_storage_ptr__->desc_function_).super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->desc_function_).super__Function_base._M_functor + 8) = 0;
  (__return_storage_ptr__->desc_function_)._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:58:49)>
       ::_M_invoke;
  (__return_storage_ptr__->desc_function_).super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:58:49)>
       ::_M_manager;
  *(undefined8 *)&(__return_storage_ptr__->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->func_).super__Function_base._M_functor + 8) = 0;
  (__return_storage_ptr__->func_)._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:62:53)>
       ::_M_invoke;
  (__return_storage_ptr__->func_).super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:62:53)>
       ::_M_manager;
  (__return_storage_ptr__->name_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->name_).field_2;
  (__return_storage_ptr__->name_)._M_string_length = 0;
  (__return_storage_ptr__->name_).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->application_index_ = -1;
  __return_storage_ptr__->active_ = true;
  __return_storage_ptr__->non_modifying_ = false;
  local_60._M_unused._M_object = &local_50;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," AND ","");
  _merge_description(__return_storage_ptr__,this,other,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_unused._0_8_ != &local_50) {
    operator_delete(local_60._M_unused._M_object);
  }
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_60,&this->func_);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_40,&other->func_);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator&
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&__return_storage_ptr__->func_
             ,(anon_class_64_2_fa08d804 *)&local_60);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if ((code *)local_50._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_50._M_allocated_capacity)(&local_60,&local_60,3);
  }
  uVar1 = false;
  if (this->active_ != false) {
    uVar1 = other->active_;
  }
  __return_storage_ptr__->active_ = (bool)uVar1;
  __return_storage_ptr__->application_index_ = this->application_index_;
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE Validator Validator::operator&(const Validator &other) const {
    Validator newval;

    newval._merge_description(*this, other, " AND ");

    // Give references (will make a copy in lambda function)
    const std::function<std::string(std::string & filename)> &f1 = func_;
    const std::function<std::string(std::string & filename)> &f2 = other.func_;

    newval.func_ = [f1, f2](std::string &input) {
        std::string s1 = f1(input);
        std::string s2 = f2(input);
        if(!s1.empty() && !s2.empty())
            return std::string("(") + s1 + ") AND (" + s2 + ")";
        return s1 + s2;
    };

    newval.active_ = active_ && other.active_;
    newval.application_index_ = application_index_;
    return newval;
}